

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O3

void bloaty::macho::ParseSegment<segment_command,section>(LoadCommand cmd,RangeSink *sink)

{
  char *__string;
  int iVar1;
  char *pcVar2;
  string_view name;
  string_view name_00;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  string_view name_01;
  string_view name_02;
  string label;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  
  if (cmd.command_data._M_len < 0x38) {
LAB_0018ea1b:
    Throw("Premature EOF reading Mach-O data.",0x36);
  }
  __string = cmd.command_data._M_str + 8;
  sVar3 = strnlen(__string,0x10);
  iVar1 = *(int *)(cmd.command_data._M_str + 0x28);
  if (sink->data_source_ == kSections) {
    iVar10 = *(int *)(cmd.command_data._M_str + 0x30);
    if (iVar10 != 0) {
      uVar9 = cmd.command_data._M_len - 0x38;
      pcVar8 = cmd.command_data._M_str + 0x38;
      do {
        bVar11 = uVar9 < 0x44;
        uVar9 = uVar9 - 0x44;
        if (bVar11) goto LAB_0018ea1b;
        uVar5 = (ulong)*(uint *)(pcVar8 + 0x24);
        if (((byte)pcVar8[0x38] < 0x13) && ((0x41002U >> ((byte)pcVar8[0x38] & 0x1f) & 1) != 0)) {
          uVar5 = 0;
        }
        local_40 = strnlen(pcVar8,0x10);
        local_50 = sVar3;
        local_48 = __string;
        local_38 = pcVar8;
        absl::strings_internal::
        JoinAlgorithm<std::basic_string_view<char,std::char_traits<char>>const*,void>
                  (&label,(strings_internal *)&local_50,&stack0xffffffffffffffd0,1,",");
        if (iVar1 == 0) {
          uVar4 = (ulong)*(uint *)(pcVar8 + 0x28);
          if (cmd.file_data._M_len < uVar4 + uVar5) goto LAB_0018ea2c;
          pcVar6 = cmd.file_data._M_str + uVar4;
          pcVar2 = (sink->file_->data_)._M_str;
          if ((pcVar2 <= pcVar6) && (pcVar6 < pcVar2 + (sink->file_->data_)._M_len)) {
            uVar7 = cmd.file_data._M_len - uVar4;
            if (uVar5 <= cmd.file_data._M_len - uVar4) {
              uVar7 = uVar5;
            }
            name_02._M_str = label._M_dataplus._M_p;
            name_02._M_len = label._M_string_length;
            RangeSink::AddFileRange(sink,"macho_section",name_02,(long)pcVar6 - (long)pcVar2,uVar7);
          }
        }
        else {
          uVar4 = (ulong)*(uint *)(pcVar8 + 0x28);
          if (cmd.file_data._M_len < uVar4 + uVar5) {
LAB_0018ea2c:
            Throw("region out-of-bounds",0x5d);
          }
          uVar7 = cmd.file_data._M_len - uVar4;
          if (uVar5 <= cmd.file_data._M_len - uVar4) {
            uVar7 = uVar5;
          }
          name_01._M_str = label._M_dataplus._M_p;
          name_01._M_len = label._M_string_length;
          RangeSink::AddRange(sink,"macho_section",name_01,(ulong)*(uint *)(pcVar8 + 0x20),
                              (ulong)*(uint *)(pcVar8 + 0x24),
                              (uint64_t)
                              (cmd.file_data._M_str + (uVar4 - (long)(sink->file_->data_)._M_str)),
                              uVar7);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)label._M_dataplus._M_p != &label.field_2) {
          operator_delete(label._M_dataplus._M_p,label.field_2._M_allocated_capacity + 1);
        }
        pcVar8 = pcVar8 + 0x44;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
  }
  else {
    if (sink->data_source_ != kSegments) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/macho.cc"
                    ,0x11f,
                    "void bloaty::macho::ParseSegment(LoadCommand, RangeSink *) [Segment = segment_command, Section = section]"
                   );
    }
    uVar5 = (ulong)*(uint *)(cmd.command_data._M_str + 0x20);
    uVar9 = (ulong)*(uint *)(cmd.command_data._M_str + 0x24);
    if (iVar1 == 0) {
      if (cmd.file_data._M_len < uVar9 + uVar5) {
LAB_0018ea60:
        Throw("region out-of-bounds",0x5d);
      }
      pcVar6 = cmd.file_data._M_str + uVar5;
      pcVar8 = (sink->file_->data_)._M_str;
      if ((pcVar8 <= pcVar6) && (pcVar6 < pcVar8 + (sink->file_->data_)._M_len)) {
        uVar4 = cmd.file_data._M_len - uVar5;
        if (uVar9 <= cmd.file_data._M_len - uVar5) {
          uVar4 = uVar9;
        }
        name_00._M_str = __string;
        name_00._M_len = sVar3;
        RangeSink::AddFileRange(sink,"macho_segment",name_00,(long)pcVar6 - (long)pcVar8,uVar4);
        return;
      }
    }
    else {
      if (cmd.file_data._M_len < uVar9 + uVar5) goto LAB_0018ea60;
      uVar4 = cmd.file_data._M_len - uVar5;
      if (uVar9 <= cmd.file_data._M_len - uVar5) {
        uVar4 = uVar9;
      }
      name._M_str = __string;
      name._M_len = sVar3;
      RangeSink::AddRange(sink,"macho_segment",name,(ulong)*(uint *)(cmd.command_data._M_str + 0x18)
                          ,(ulong)*(uint *)(cmd.command_data._M_str + 0x1c),
                          (uint64_t)
                          (cmd.file_data._M_str + (uVar5 - (long)(sink->file_->data_)._M_str)),uVar4
                         );
    }
  }
  return;
}

Assistant:

const T* GetStructPointerAndAdvance(string_view* data) {
  const T* ret = GetStructPointer<T>(*data);
  *data = data->substr(sizeof(T));
  return ret;
}